

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

double __thiscall chrono::utils::ChISO2631_5_Wxy::Filter(ChISO2631_5_Wxy *this,double u)

{
  undefined1 in_register_00001208 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar1._8_56_ = in_register_00001208;
  auVar1._0_8_ = u;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_u_hist2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_y_hist1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_u_hist1 * 0.00433451;
  auVar4 = vfmadd231sd_fma(auVar4,auVar1._0_16_,ZEXT816(0x3f93bce0c67ed4f2));
  auVar4 = vfmadd231sd_fma(auVar4,auVar2,ZEXT816(0xbf912dce6f643bea));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_y_hist2;
  this->m_u_hist2 = this->m_u_hist1;
  this->m_u_hist1 = u;
  this->m_y_hist2 = this->m_y_hist1;
  auVar4 = vfmadd231sd_fma(auVar4,auVar5,ZEXT816(0x3fff5057d1782d38));
  auVar4 = vfmadd132sd_fma(auVar3,auVar4,ZEXT816(0xbfeed8ab92c06184));
  this->m_y_hist1 = auVar4._0_8_;
  return auVar4._0_8_;
}

Assistant:

double ChISO2631_5_Wxy::Filter(double u) {
    double y = m_b0 * u + m_b1 * m_u_hist1 + m_b2 * m_u_hist2 - m_a1 * m_y_hist1 - m_a2 * m_y_hist2;

    m_u_hist2 = m_u_hist1;
    m_u_hist1 = u;
    m_y_hist2 = m_y_hist1;
    m_y_hist1 = y;

    return y;
}